

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddStore
          (InstructionBuilder *this,uint32_t ptr_id,uint32_t obj_id)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  Instruction *pIVar1;
  IRContext *c;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_118
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> new_inst;
  SmallVector<unsigned_int,_2UL> local_f8;
  Operand local_d0;
  uint32_t local_9c;
  iterator local_98;
  undefined8 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  Operand local_60;
  undefined1 local_30 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  uint32_t obj_id_local;
  uint32_t ptr_id_local;
  InstructionBuilder *this_local;
  
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = obj_id;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = ptr_id;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_30);
  local_9c = operands.
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  local_98 = &local_9c;
  local_90 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_98;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,init_list_00);
  Operand::Operand(&local_60,SPV_OPERAND_TYPE_ID,&local_88);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_30,
             &local_60);
  Operand::~Operand(&local_60);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88);
  new_inst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       (uint32_t)
       operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  init_list._M_len = 1;
  init_list._M_array =
       (iterator)
       ((long)&new_inst._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl + 4);
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f8,init_list);
  Operand::Operand(&local_d0,SPV_OPERAND_TYPE_ID,&local_f8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_30,
             &local_d0);
  Operand::~Operand(&local_d0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f8);
  pIVar1 = (Instruction *)::operator_new(0x70);
  c = GetContext(this);
  opt::Instruction::Instruction(pIVar1,c,OpStore,0,0,(OperandList *)local_30);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_118,pIVar1);
  pIVar1 = AddInstruction(this,&local_118);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_118);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_30);
  return pIVar1;
}

Assistant:

Instruction* AddStore(uint32_t ptr_id, uint32_t obj_id) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {ptr_id}});
    operands.push_back({SPV_OPERAND_TYPE_ID, {obj_id}});

    std::unique_ptr<Instruction> new_inst(
        new Instruction(GetContext(), spv::Op::OpStore, 0, 0, operands));
    return AddInstruction(std::move(new_inst));
  }